

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O2

int fmt::fprintf(FILE *__stream,char *__format,...)

{
  size_t __size;
  size_t sVar1;
  uint64_t in_RCX;
  BasicCStringRef<char> in_RDX;
  anon_union_8_2_de49483c_for_ArgList_1 in_R8;
  ArgList args;
  MemoryWriter w;
  
  w.super_BasicWriter<char>.buffer_ = &w.buffer_.super_Buffer<char>;
  w.super_BasicWriter<char>._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_0014cbf0;
  w.buffer_.super_Buffer<char>.ptr_ = w.buffer_.data_;
  w.buffer_.super_Buffer<char>.size_ = 0;
  w.buffer_.super_Buffer<char>.capacity_ = 500;
  w.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_0014cc38;
  args.field_1.args_ = in_R8.args_;
  args.types_ = in_RCX;
  printf<char>((fmt *)&w,(BasicWriter<char> *)__format,in_RDX,args);
  __size = (w.super_BasicWriter<char>.buffer_)->size_;
  sVar1 = fwrite((w.super_BasicWriter<char>.buffer_)->ptr_,__size,1,__stream);
  BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(&w);
  return -(uint)(sVar1 == 0) | (uint)__size;
}

Assistant:

FMT_FUNC int fmt::fprintf(std::FILE *f, CStringRef format, ArgList args) {
  MemoryWriter w;
  printf(w, format, args);
  std::size_t size = w.size();
  return !std::fwrite(w.data(), size, 1, f) ? -1 : static_cast<int>(size);
}